

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O0

void kv_set_str_key_test(btree_kv_ops *kv_ops)

{
  byte bVar1;
  _func_void_btree_ptr_void_ptr_void_ptr *p_Var2;
  long lVar3;
  void *pvVar4;
  btree *pbVar5;
  int iVar6;
  size_t sVar7;
  undefined8 uStack_c0;
  btree local_b8;
  void *local_80;
  char *dst;
  char src [7];
  btree *tree;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  btree_kv_ops *kv_ops_local;
  
  uStack_c0 = 0x1030ac;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  uStack_c0 = 0x1030b9;
  memleak_start();
  _src = &local_b8;
  dst._4_3_ = 0x7965;
  dst._0_4_ = 0x6b637273;
  uStack_c0 = 0x1030db;
  sVar7 = strlen((char *)&dst);
  lVar3 = -(sVar7 + 0xf & 0xfffffffffffffff0);
  local_80 = (void *)((long)&local_b8 + lVar3);
  *(undefined8 *)((long)&uStack_c0 + lVar3) = 0x1030fc;
  sVar7 = strlen((char *)&dst);
  _src->ksize = (uint8_t)sVar7;
  pbVar5 = _src;
  pvVar4 = local_80;
  p_Var2 = kv_ops->set_key;
  *(undefined8 *)((long)&uStack_c0 + lVar3) = 0x10311a;
  (*p_Var2)(pbVar5,pvVar4,&dst);
  pvVar4 = local_80;
  bVar1 = _src->ksize;
  *(undefined8 *)((long)&uStack_c0 + lVar3) = 0x103130;
  iVar6 = memcmp(pvVar4,&dst,(ulong)bVar1);
  if (iVar6 != 0) {
    *(undefined8 *)((long)&uStack_c0 + lVar3) = 0x103159;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x1ad);
    pvVar4 = local_80;
    kv_set_str_key_test::__test_pass = 0;
    bVar1 = _src->ksize;
    *(undefined8 *)((long)&uStack_c0 + lVar3) = 0x103179;
    iVar6 = memcmp(pvVar4,&dst,(ulong)bVar1);
    if (iVar6 != 0) {
      *(undefined8 *)((long)&uStack_c0 + lVar3) = 0x1031a8;
      __assert_fail("!memcmp(dst, src, tree->ksize)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x1ad,"void kv_set_str_key_test(btree_kv_ops *)");
    }
  }
  *(undefined8 *)((long)&uStack_c0 + lVar3) = 0x1031af;
  memleak_end();
  if (kv_set_str_key_test::__test_pass == 0) {
    *(undefined8 *)((long)&uStack_c0 + lVar3) = 0x1031f8;
    fprintf(_stderr,"%s FAILED\n","kv_set_str_key_test");
  }
  else {
    *(undefined8 *)((long)&uStack_c0 + lVar3) = 0x1031d7;
    fprintf(_stderr,"%s PASSED\n","kv_set_str_key_test");
  }
  return;
}

Assistant:

void kv_set_str_key_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    btree *tree = alca(struct btree, 1);
    char src[] = "srckey";
    char *dst = alca(char, strlen(src));
    tree->ksize = strlen(src);
    kv_ops->set_key(tree, dst, src);
    TEST_CHK(!memcmp(dst, src, tree->ksize));

    memleak_end();
    TEST_RESULT("kv_set_str_key_test");
}